

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createCompositeExtract(Builder *this,Id composite,Id typeId,uint index)

{
  Block *this_00;
  Id resultId;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_88;
  Instruction *local_80;
  Instruction *extract;
  allocator_type local_61;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_60;
  allocator_type local_41;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_40;
  uint local_24;
  Id local_20;
  uint index_local;
  Id typeId_local;
  Id composite_local;
  Builder *this_local;
  
  local_24 = index;
  local_20 = typeId;
  index_local = composite;
  _typeId_local = this;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_01 = (Instruction *)
              Instruction::operator_new
                        ((Instruction *)0x38,CONCAT44(in_register_00000034,composite));
    resultId = getUniqueId(this);
    Instruction::Instruction(this_01,resultId,local_20,OpCompositeExtract);
    local_80 = this_01;
    Instruction::addIdOperand(this_01,index_local);
    Instruction::addImmediateOperand(local_80,local_24);
    this_00 = this->buildPoint;
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_88,
               local_80);
    Block::addInstruction(this_00,&local_88);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_88);
    this_local._4_4_ = Instruction::getResultId(local_80);
  }
  else {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_40,1,&index_local,&local_41);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_60,1,&local_24,&local_61);
    this_local._4_4_ = createSpecConstantOp(this,OpCompositeExtract,typeId,&local_40,&local_60);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_60);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_40);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createCompositeExtract(Id composite, Id typeId, unsigned index)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        return createSpecConstantOp(OpCompositeExtract, typeId, dxil_spv::Vector<Id>(1, composite), dxil_spv::Vector<Id>(1, index));
    }
    Instruction* extract = new Instruction(getUniqueId(), typeId, OpCompositeExtract);
    extract->addIdOperand(composite);
    extract->addImmediateOperand(index);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(extract));

    return extract->getResultId();
}